

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

String __thiscall
testing::internal::FormatForComparisonFailureMessage<long_long,long_long>
          (internal *this,longlong *value,longlong *param_2)

{
  size_t extraout_RDX;
  String SVar1;
  testing *this_00;
  String *in_stack_ffffffffffffffb0;
  testing local_40 [32];
  longlong *local_20;
  longlong *param_1_local;
  longlong *value_local;
  
  this_00 = local_40;
  local_20 = param_2;
  param_1_local = value;
  value_local = (longlong *)this;
  PrintToString<long_long>(this_00,value);
  String::String(in_stack_ffffffffffffffb0,(string *)this_00);
  std::__cxx11::string::~string((string *)local_40);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)this;
  return SVar1;
}

Assistant:

String FormatForComparisonFailureMessage(const T1& value,
                                         const T2& /* other_operand */) {
  // C++Builder compiles this incorrectly if the namespace isn't explicitly
  // given.
  return ::testing::PrintToString(value);
}